

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O1

IceTBoolean icetStrategySupportsOrdering(IceTEnum strategy)

{
  char *msg;
  int line;
  
  switch(strategy) {
  case 0x6001:
  case 0x6002:
  case 0x6004:
    return '\x01';
  case 0x6003:
  case 0x6005:
    goto switchD_00115221_caseD_6001;
  default:
    if (strategy == 0xffffffff) {
      msg = "Strategy not defined. Use icetStrategy to set the strategy.";
      line = 0x60;
    }
    else {
      msg = "Invalid strategy.";
      line = 99;
    }
    icetRaiseDiagnostic(msg,0xfffffffe,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/strategies/select.c"
                        ,line);
switchD_00115221_caseD_6001:
    return '\0';
  }
}

Assistant:

IceTBoolean icetStrategySupportsOrdering(IceTEnum strategy)
{
    switch (strategy) {
      case ICET_STRATEGY_DIRECT:        return ICET_TRUE;
      case ICET_STRATEGY_SEQUENTIAL:    return ICET_TRUE;
      case ICET_STRATEGY_SPLIT:         return ICET_FALSE;
      case ICET_STRATEGY_REDUCE:        return ICET_TRUE;
      case ICET_STRATEGY_VTREE:         return ICET_FALSE;
      case ICET_STRATEGY_UNDEFINED:
          icetRaiseError("Strategy not defined. "
                         "Use icetStrategy to set the strategy.",
                         ICET_INVALID_ENUM);
          return ICET_FALSE;
      default:
          icetRaiseError("Invalid strategy.", ICET_INVALID_ENUM);
          return ICET_FALSE;
    }
}